

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O2

void __thiscall QSignalSpy::QSignalSpy(QSignalSpy *this,ObjectSignal os)

{
  QList<int> *this_00;
  QSignalSpyPrivate *pQVar1;
  Data *pDVar2;
  int iVar3;
  uint uVar4;
  RestrictedBool RVar5;
  char *pcVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<QByteArray> local_a0;
  QArrayDataPointer<QByteArray> local_88;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  QMetaType tp;
  QMetaObject *local_48;
  uint *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QList<QList<QVariant>_>).d.size = 0;
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
  super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl = (QSignalSpyPrivate *)0x0;
  (this->super_QList<QList<QVariant>_>).d.d = (Data *)0x0;
  (this->super_QList<QList<QVariant>_>).d.ptr = (QList<QVariant> *)0x0;
  QMetaMethod::methodSignature();
  this_00 = &this->args;
  if (os.obj == (QObject *)0x0) {
    (this_00->d).d = (Data *)0x0;
    (this->args).d.ptr = (int *)0x0;
    (this->args).d.size = 0;
  }
  else {
    local_48 = os.sig.mobj;
    puStack_40 = os.sig.data.d;
    (this_00->d).d = (Data *)0x0;
    (this->args).d.ptr = (int *)0x0;
    (this->args).d.size = 0;
    iVar3 = QMetaMethod::parameterCount();
    QList<int>::reserve(this_00,(long)iVar3);
    lVar7 = 8;
    for (lVar9 = 0; iVar3 = QMetaMethod::parameterCount(), lVar9 < iVar3; lVar9 = lVar9 + 1) {
      tp.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
      tp.d_ptr = (QMetaTypeInterface *)QMetaMethod::parameterMetaType((int)&local_48);
      if (tp.d_ptr == (QMetaTypeInterface *)0x0) {
        local_70._0_4_ = 2;
        local_70._4_4_ = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        local_5c = 0;
        local_58 = "default";
        QMetaMethod::parameterNames();
        puVar10 = *(undefined8 **)((long)&((local_88.ptr)->d).d + lVar7);
        if (puVar10 == (undefined8 *)0x0) {
          puVar10 = &QByteArray::_empty;
        }
        QMetaMethod::parameterTypes();
        puVar8 = *(undefined8 **)((long)&((local_a0.ptr)->d).d + lVar7);
        QMetaMethod::name();
        if (puVar8 == (undefined8 *)0x0) {
          puVar8 = &QByteArray::_empty;
        }
        pcVar6 = local_b8.ptr;
        if (local_b8.ptr == (char *)0x0) {
          pcVar6 = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)&local_70,
                   "QSignalSpy: Unable to handle parameter \'%s\' of type \'%s\' of method \'%s\', use qRegisterMetaType to register it."
                   ,puVar10,puVar8,pcVar6);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_a0);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_88);
      }
      iVar3 = QMetaType::registerHelper(&tp);
      QList<int>::append(this_00,iVar3);
      lVar7 = lVar7 + 0x18;
    }
  }
  QTestEventLoop::QTestEventLoop(&this->m_loop,(QObject *)0x0);
  this->m_waiting = false;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  if (os.obj != (QObject *)0x0) {
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = this;
    std::make_unique<QSignalSpyPrivate,QSignalSpy*>((QSignalSpy **)&local_88);
    uVar4 = QMetaMethod::methodIndex();
    iVar3 = QMetaObject::methodCount();
    QMetaObject::connect
              ((QObject *)&local_70,(int)os.obj,(QObject *)(ulong)uVar4,(int)local_88.d,iVar3,
               (int *)0x1);
    RVar5 = QMetaObject::Connection::operator_cast_to__((Connection *)&local_70);
    QMetaObject::Connection::~Connection((Connection *)&local_70);
    pDVar2 = local_88.d;
    if (RVar5 == 0xffffffffffffffff) {
      local_70._0_4_ = 2;
      local_5c = 0;
      local_70._4_4_ = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      local_58 = "default";
      QMessageLogger::warning
                ((char *)&local_70,
                 "QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
    }
    else {
      local_88.d = (Data *)0x0;
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
               super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl;
      (this->d_ptr)._M_t.
      super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
      super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl = (QSignalSpyPrivate *)pDVar2;
      if (pQVar1 == (QSignalSpyPrivate *)0x0) goto LAB_00120a73;
      (**(code **)(*(long *)pQVar1 + 0x20))();
    }
    if ((QSignalSpyPrivate *)local_88.d != (QSignalSpyPrivate *)0x0) {
      (**(code **)(*(long *)local_88.d + 0x20))();
    }
  }
LAB_00120a73:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSignalSpy::QSignalSpy(ObjectSignal os)
    : sig(os.sig.methodSignature()),
      args(os.obj ? makeArgs(os.sig) : QList<int>{})
{
    if (!os.obj)
        return;

    auto i = std::make_unique<QSignalSpyPrivate>(this);

    const auto signalIndex = os.sig.methodIndex();
    const auto slotIndex = QObject::staticMetaObject.methodCount();
    if (!QMetaObject::connect(os.obj, signalIndex,
                              i.get(), slotIndex, Qt::DirectConnection)) {
        qWarning("QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
        return;
    }

    d_ptr = std::move(i);
}